

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager_test.cpp
# Opt level: O2

void __thiscall
JobManagerTestSuite_MalformedCredentialsJobCreateFailsByName_Test::
~JobManagerTestSuite_MalformedCredentialsJobCreateFailsByName_Test
          (JobManagerTestSuite_MalformedCredentialsJobCreateFailsByName_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(JobManagerTestSuite, MalformedCredentialsJobCreateFailsByName)
{
    ASSERT_EQ(system("rm -rf ./tmp/dom ./tmp/nwk"), 0);

    EXPECT_EQ(mkdir("./tmp/nwk", 0777), 0);
    EXPECT_EQ(mkdir("./tmp/nwk/pan1", 0777), 0);
    EXPECT_EQ(mkdir("./tmp/nwk/pan2", 0777), 0);
    EXPECT_EQ(mkdir("./tmp/nwk/pan3", 0777), 0);

    // Loose credentials for Network 1
    EXPECT_EQ(WriteFile("1", "./tmp/nwk/pan1/ca.pem").mCode, ErrorCode::kNone);
    EXPECT_EQ(WriteFile("1", "./tmp/nwk/pan1/priv.pem").mCode, ErrorCode::kNone);
    // Loose credentials for panwork 2
    EXPECT_EQ(WriteFile("1", "./tmp/nwk/pan2/cert.pem").mCode, ErrorCode::kNone);
    EXPECT_EQ(WriteFile("1", "./tmp/nwk/pan2/priv.pem").mCode, ErrorCode::kNone);
    // Loose credentials for panwork 3
    EXPECT_EQ(WriteFile("1", "./tmp/nwk/pan3/cert.pem").mCode, ErrorCode::kNone);
    EXPECT_EQ(WriteFile("1", "./tmp/nwk/pan3/ca.pem").mCode, ErrorCode::kNone);

    TestContext ctx;
    SetInitialExpectations(ctx);

    using namespace ot::commissioner::persistent_storage;
    // Prepare test data
    NetworkId      nid;
    BorderRouterId rid;

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan1", 1, 1, 0x1, "", 1}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 0);

    BorderAgent::State baState{BorderAgent::State::ConnectionMode::kPSKcConnection,
                               BorderAgent::State::ThreadInterfaceStatus::kActive,
                               BorderAgent::State::Availability::kHigh, 0, 0};
    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", baState, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan2", 2, 2, 0x2, "", 1}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20002, ByteArray{}, "1.1", baState, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan3", 3, 3, 0x3, "", 1}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 2);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20003, ByteArray{}, "1.1", baState, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 2);

    Init(ctx, ".");

    uint8_t                camIdx                  = 0;
    CommissionerAppMockPtr commissionerAppMocks[3] = {CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()}};

    ON_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .WillByDefault(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMocks[camIdx++]; }),
                  Return(Error{})));

    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"start"}, {0x1, 0x2, 0x3}, false).mCode, ErrorCode::kNone);
    EXPECT_EQ(camIdx, 0);
    EXPECT_EQ(ctx.mJobManager.mJobPool.size(), 0);
}